

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::expectCancel(TestMoreStuffImpl *this,ExpectCancelContext context)

{
  long *plVar1;
  undefined8 *in_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar2;
  pointer_____offset_0x10___ *local_b0;
  undefined8 *local_a8;
  long *local_a0;
  StructReader local_98;
  PointerReader local_68;
  PointerReader local_48;
  
  (**(code **)*in_RDX)(&local_48);
  local_68.pointer = local_48.pointer;
  local_68.nestingLimit = local_48.nestingLimit;
  local_68._28_4_ = local_48._28_4_;
  local_68.segment = local_48.segment;
  local_68.capTable = local_48.capTable;
  PointerReader::getStruct(&local_98,&local_68,(word *)0x0);
  if (local_98.pointerCount == 0) {
    local_98.nestingLimit = 0x7fffffff;
    local_98.pointers = (WirePointer *)0x0;
    local_98.segment = (SegmentReader *)0x0;
    local_98.capTable = (CapTableReader *)0x0;
  }
  local_68.nestingLimit = local_98.nestingLimit;
  local_68.segment = local_98.segment;
  local_68.capTable = local_98.capTable;
  local_68.pointer = local_98.pointers;
  OVar2 = PointerReader::getCapability(&local_48);
  (*(local_48.capTable)->_vptr_CapTableReader[4])(&local_a8,local_48.capTable,OVar2.ptr);
  local_b0 = &Capability::Client::typeinfo;
  loop(this,(uint)context.hook,(Client *)0x0,(CallContextHook *)&local_b0);
  plVar1 = local_a0;
  if (local_a0 != (long *)0x0) {
    local_a0 = (long *)0x0;
    (**(code **)*local_a8)(local_a8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  (*(code *)(local_48.segment)->arena->_vptr_Arena)
            (local_48.segment,
             (local_48.capTable)->_vptr_CapTableReader[-2] +
             (long)&(local_48.capTable)->_vptr_CapTableReader);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::expectCancel(ExpectCancelContext context) {
  auto cap = context.getParams().getCap();
  return loop(0, cap, context);
}